

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_test_case_registry_impl.hpp
# Opt level: O2

void __thiscall
Catch::TestRegistry::getFilteredTests
          (TestRegistry *this,TestSpec *testSpec,IConfig *config,
          vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> *matchingTestCases,bool negated)

{
  pointer pTVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  undefined3 in_register_00000081;
  pointer __x;
  
  pTVar1 = (this->m_functionsInOrder).
           super__Vector_base<Catch::TestCase,_std::allocator<Catch::TestCase>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (__x = (this->m_functionsInOrder).
             super__Vector_base<Catch::TestCase,_std::allocator<Catch::TestCase>_>._M_impl.
             super__Vector_impl_data._M_start; __x != pTVar1; __x = __x + 1) {
    bVar2 = TestSpec::matches(testSpec,&__x->super_TestCaseInfo);
    uVar4 = 0;
    if (bVar2) {
      iVar3 = (*(config->super_IShared).super_NonCopyable._vptr_NonCopyable[4])(config);
      uVar4 = 1;
      if ((char)iVar3 == '\0') {
        uVar4 = (uint)(((__x->super_TestCaseInfo).properties & Throws) == None);
      }
    }
    if (uVar4 != CONCAT31(in_register_00000081,negated)) {
      std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>::push_back
                (matchingTestCases,__x);
    }
  }
  sortTests(config,matchingTestCases);
  return;
}

Assistant:

virtual void getFilteredTests( TestSpec const& testSpec, IConfig const& config, std::vector<TestCase>& matchingTestCases, bool negated = false ) const {

            for( std::vector<TestCase>::const_iterator  it = m_functionsInOrder.begin(),
                                                        itEnd = m_functionsInOrder.end();
                    it != itEnd;
                    ++it ) {
                bool includeTest = testSpec.matches( *it ) && ( config.allowThrows() || !it->throws() );
                if( includeTest != negated )
                    matchingTestCases.push_back( *it );
            }
            sortTests( config, matchingTestCases );
        }